

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O2

void __thiscall
TPZGenGrid2D::TPZGenGrid2D
          (TPZGenGrid2D *this,TPZVec<int> *nx,TPZVec<double> *x0,TPZVec<double> *x1,int numl,
          REAL rot)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  int *piVar5;
  double *pdVar6;
  double local_38;
  
  this->_vptr_TPZGenGrid2D = (_func_int **)&PTR__TPZGenGrid2D_01816750;
  TPZManVector<int,_10>::TPZManVector(&this->fNx,nx);
  TPZManVector<double,_10>::TPZManVector(&this->fX0,x0);
  TPZManVector<double,_10>::TPZManVector(&this->fX1,x1);
  TPZManVector<double,_10>::TPZManVector(&this->fDelx,2);
  local_38 = 1.0;
  TPZManVector<double,_10>::TPZManVector(&this->fGeometricProgression,2,&local_38);
  this->fNumLayers = numl;
  this->fRotAngle = rot;
  this->fZigZag = false;
  this->fTrapeze = false;
  this->fDistortion = 0.0;
  this->fRefPattern = false;
  pdVar3 = x1->fStore;
  pdVar4 = x0->fStore;
  piVar5 = nx->fStore;
  iVar1 = *piVar5;
  pdVar6 = (this->fDelx).super_TPZVec<double>.fStore;
  *pdVar6 = (*pdVar3 - *pdVar4) / (double)iVar1;
  iVar2 = piVar5[1];
  pdVar6[1] = (pdVar3[1] - pdVar4[1]) / (double)iVar2;
  this->fNumNodes = (long)((iVar1 + (numl + -1) * iVar1 + 1) * (iVar2 + 1));
  this->fMeshType = EQuadrilateral;
  return;
}

Assistant:

TPZGenGrid2D::TPZGenGrid2D(const TPZVec<int> &nx, const TPZVec<REAL> &x0, const TPZVec<REAL> &x1, int numl, REAL rot) : fNx(nx), fX0(x0), fX1(x1),
fDelx(2), fGeometricProgression(2, 1.), fNumLayers(numl), fRotAngle(rot), fZigZag(false), fTrapeze(false), fDistortion(0.), fRefPattern(false) {
    fDelx[0] = (x1[0] - x0[0]) / (nx[0]); // Delta x
    fDelx[1] = (x1[1] - x0[1]) / (nx[1]); // Delta y
    fNumNodes = (nx[0] + 1)*(nx[1] + 1)+(fNumLayers - 1)*(nx[0])*(nx[1] + 1);
    fMeshType = MMeshType::EQuadrilateral;
}